

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeMoveto(BtCursor *pCur,void *pKey,i64 nKey,int bias,int *pRes)

{
  UnpackedRecord *local_48;
  UnpackedRecord *pIdxKey;
  int rc;
  int *pRes_local;
  int bias_local;
  i64 nKey_local;
  void *pKey_local;
  BtCursor *pCur_local;
  
  if (pKey == (void *)0x0) {
    local_48 = (UnpackedRecord *)0x0;
  }
  else {
    local_48 = sqlite3VdbeAllocUnpackedRecord(pCur->pKeyInfo);
    if (local_48 == (UnpackedRecord *)0x0) {
      return 7;
    }
    sqlite3VdbeRecordUnpack(pCur->pKeyInfo,(int)nKey,pKey,local_48);
    if (local_48->nField == 0) {
      pIdxKey._4_4_ = sqlite3CorruptError(0xebb1);
      goto LAB_0015c2d8;
    }
  }
  pIdxKey._4_4_ = sqlite3BtreeMovetoUnpacked(pCur,local_48,nKey,bias,pRes);
LAB_0015c2d8:
  if (local_48 != (UnpackedRecord *)0x0) {
    sqlite3DbFree(pCur->pKeyInfo->db,local_48);
  }
  return pIdxKey._4_4_;
}

Assistant:

static int btreeMoveto(
  BtCursor *pCur,     /* Cursor open on the btree to be searched */
  const void *pKey,   /* Packed key if the btree is an index */
  i64 nKey,           /* Integer key for tables.  Size of pKey for indices */
  int bias,           /* Bias search to the high end */
  int *pRes           /* Write search results here */
){
  int rc;                    /* Status code */
  UnpackedRecord *pIdxKey;   /* Unpacked index key */

  if( pKey ){
    assert( nKey==(i64)(int)nKey );
    pIdxKey = sqlite3VdbeAllocUnpackedRecord(pCur->pKeyInfo);
    if( pIdxKey==0 ) return SQLITE_NOMEM_BKPT;
    sqlite3VdbeRecordUnpack(pCur->pKeyInfo, (int)nKey, pKey, pIdxKey);
    if( pIdxKey->nField==0 ){
      rc = SQLITE_CORRUPT_PGNO(pCur->apPage[pCur->iPage]->pgno);
      goto moveto_done;
    }
  }else{
    pIdxKey = 0;
  }
  rc = sqlite3BtreeMovetoUnpacked(pCur, pIdxKey, nKey, bias, pRes);
moveto_done:
  if( pIdxKey ){
    sqlite3DbFree(pCur->pKeyInfo->db, pIdxKey);
  }
  return rc;
}